

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QVersionNumber *version)

{
  long lVar1;
  QDebug *this;
  QString *t;
  QDebugStateSaver *pQVar2;
  QDebugStateSaver *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  Stream *pSVar3;
  char *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = in_RDI;
  pQVar2 = in_RSI;
  QDebugStateSaver::QDebugStateSaver(in_RSI,(QDebug *)in_RDI);
  this = QDebug::nospace((QDebug *)in_RSI);
  QDebug::noquote(this);
  t = (QString *)QDebug::operator<<(this,in_stack_ffffffffffffffd8);
  QVersionNumber::toString((QVersionNumber *)pQVar2);
  pQVar2 = (QDebugStateSaver *)QDebug::operator<<((QDebug *)in_RDI,t);
  QDebug::operator<<(this,in_stack_ffffffffffffffd8);
  QString::~QString((QString *)0x6385af);
  QDebug::QDebug((QDebug *)in_RDI,(QDebug *)t);
  QDebugStateSaver::~QDebugStateSaver(pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)pSVar3;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QVersionNumber &version)
{
    QDebugStateSaver saver(debug);
    debug.nospace().noquote();
    debug << "QVersionNumber(" << version.toString() << ")";
    return debug;
}